

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_from_file
          (mipmapped_texture *this,char *pFilename,format file_format)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 local_80 [8];
  data_stream_serializer serializer;
  undefined1 local_60 [8];
  cfile_stream in_stream;
  bool success;
  format file_format_local;
  char *pFilename_local;
  mipmapped_texture *this_local;
  
  in_stream._60_4_ = file_format;
  clear(this);
  set_last_error(this,"Can\'t open file");
  in_stream._59_1_ = 0;
  cfile_stream::cfile_stream((cfile_stream *)local_60);
  uVar2 = cfile_stream::open((cfile_stream *)local_60,pFilename,5,0);
  if ((uVar2 & 1) != 0) {
    data_stream_serializer::data_stream_serializer
              ((data_stream_serializer *)local_80,(data_stream *)local_60);
    in_stream._59_1_ = read_from_stream(this,(data_stream_serializer *)local_80,in_stream._60_4_);
  }
  uVar1 = in_stream._59_1_;
  cfile_stream::~cfile_stream((cfile_stream *)local_60);
  return (bool)(uVar1 & 1);
}

Assistant:

bool mipmapped_texture::read_from_file(const char* pFilename, texture_file_types::format file_format) {
  clear();

  set_last_error("Can't open file");

  bool success = false;

  cfile_stream in_stream;
  if (in_stream.open(pFilename)) {
    data_stream_serializer serializer(in_stream);
    success = read_from_stream(serializer, file_format);
  }

  return success;
}